

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O0

void __thiscall
btGeneric6DofSpring2Constraint::setAxis
          (btGeneric6DofSpring2Constraint *this,btVector3 *axis1,btVector3 *axis2)

{
  btMatrix3x3 *xx;
  btMatrix3x3 *this_00;
  btScalar *yz;
  btScalar *pbVar1;
  btScalar *pbVar2;
  btScalar *pbVar3;
  btTransform *in_RDI;
  btTransform frameInW;
  btVector3 xAxis;
  btVector3 yAxis;
  btVector3 zAxis;
  btTransform *other;
  btTransform *in_stack_fffffffffffffe10;
  btGeneric6DofSpring2Constraint *this_01;
  btVector3 *in_stack_fffffffffffffe18;
  btTransform *in_stack_fffffffffffffe20;
  btTransform *t;
  btTransform *in_stack_fffffffffffffe78;
  btTransform local_90;
  btVector3 local_50;
  btVector3 local_40;
  btVector3 local_30 [2];
  
  local_30[0] = btVector3::normalized(in_stack_fffffffffffffe18);
  local_40 = btVector3::normalized(in_stack_fffffffffffffe18);
  local_50 = btVector3::cross((btVector3 *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  btTransform::btTransform(in_stack_fffffffffffffe10);
  btTransform::setIdentity(in_stack_fffffffffffffe20);
  xx = btTransform::getBasis(&local_90);
  this_00 = (btMatrix3x3 *)btVector3::operator_cast_to_float_(&local_50);
  btVector3::operator_cast_to_float_(&local_40);
  yz = btVector3::operator_cast_to_float_(local_30);
  pbVar1 = btVector3::operator_cast_to_float_(&local_50);
  pbVar1 = pbVar1 + 1;
  pbVar2 = btVector3::operator_cast_to_float_(&local_40);
  pbVar2 = pbVar2 + 1;
  pbVar3 = btVector3::operator_cast_to_float_(local_30);
  other = (btTransform *)(pbVar3 + 1);
  pbVar3 = btVector3::operator_cast_to_float_(&local_50);
  this_01 = (btGeneric6DofSpring2Constraint *)(pbVar3 + 2);
  pbVar3 = btVector3::operator_cast_to_float_(&local_40);
  t = (btTransform *)(pbVar3 + 2);
  pbVar3 = btVector3::operator_cast_to_float_(local_30);
  btMatrix3x3::setValue
            (this_00,(btScalar *)xx,pbVar3 + 2,(btScalar *)t,(btScalar *)this_01,(btScalar *)other,
             yz,pbVar1,pbVar2,(btScalar *)this_01);
  btRigidBody::getCenterOfMassTransform(*(btRigidBody **)((in_RDI->m_basis).m_el[2].m_floats + 2));
  btTransform::inverse(in_stack_fffffffffffffe78);
  btTransform::operator*(in_RDI,t);
  btTransform::operator=((btTransform *)this_01,other);
  btRigidBody::getCenterOfMassTransform(*(btRigidBody **)(in_RDI->m_origin).m_floats);
  btTransform::inverse(in_stack_fffffffffffffe78);
  btTransform::operator*(in_RDI,t);
  btTransform::operator=((btTransform *)this_01,other);
  calculateTransforms(this_01);
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::setAxis(const btVector3& axis1,const btVector3& axis2)
{
	btVector3 zAxis = axis1.normalized();
	btVector3 yAxis = axis2.normalized();
	btVector3 xAxis = yAxis.cross(zAxis); // we want right coordinate system
	
	btTransform frameInW;
	frameInW.setIdentity();
	frameInW.getBasis().setValue( xAxis[0], yAxis[0], zAxis[0],
	                              xAxis[1], yAxis[1], zAxis[1],
	                              xAxis[2], yAxis[2], zAxis[2]);
	
	// now get constraint frame in local coordinate systems
	m_frameInA = m_rbA.getCenterOfMassTransform().inverse() * frameInW;
	m_frameInB = m_rbB.getCenterOfMassTransform().inverse() * frameInW;
	
	calculateTransforms();
}